

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall soplex::CLUFactor<double>::solveUpdateRight(CLUFactor<double> *this,double *vec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long in_RSI;
  long in_RDI;
  int *lbeg;
  int *idx;
  int *lidx;
  int *lrow;
  double *val;
  double *lval;
  double x;
  int end;
  int k;
  int j;
  int i;
  int *local_50;
  double *local_38;
  int local_18;
  int local_14;
  
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x25c365);
  lVar4 = *(long *)(in_RDI + 0x78);
  lVar5 = *(long *)(in_RDI + 0x98);
  lVar6 = *(long *)(in_RDI + 0x90);
  iVar2 = *(int *)(in_RDI + 0x88);
  for (local_14 = *(int *)(in_RDI + 0x84); local_14 < iVar2; local_14 = local_14 + 1) {
    dVar1 = *(double *)(in_RSI + (long)*(int *)(lVar5 + (long)local_14 * 4) * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      iVar3 = *(int *)(lVar6 + (long)local_14 * 4);
      local_50 = (int *)(lVar4 + (long)iVar3 * 4);
      local_38 = pdVar7 + iVar3;
      for (local_18 = *(int *)(lVar6 + (long)(local_14 + 1) * 4); iVar3 < local_18;
          local_18 = local_18 + -1) {
        *(double *)(in_RSI + (long)*local_50 * 8) =
             *(double *)(in_RSI + (long)*local_50 * 8) - dVar1 * *local_38;
        local_50 = local_50 + 1;
        local_38 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUpdateRight(R* vec)
{
   int i, j, k;
   int end;
   R x;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUnused;

   for(i = l.firstUpdate; i < end; ++i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }
}